

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.h
# Opt level: O0

void __thiscall
ExpressionEvalContext::ExpressionEvalContext
          (ExpressionEvalContext *this,ExpressionContext *ctx,Allocator *allocator)

{
  Allocator *allocator_local;
  ExpressionContext *ctx_local;
  ExpressionEvalContext *this_local;
  
  this->ctx = ctx;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::SmallArray(&this->stackFrames,allocator);
  SmallArray<ExprPointerLiteral_*,_32U>::SmallArray(&this->abandonedMemory,allocator);
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->errorCritical = false;
  this->globalFrame = (StackFrame *)0x0;
  this->emulateKnownExternals = false;
  this->stackDepthLimit = 0x40;
  this->variableMemoryLimit = 0x2000;
  this->totalMemory = 0;
  this->totalMemoryLimit = 0x10000;
  this->instruction = 0;
  this->instructionsLimit = 0x10000;
  this->expressionDepth = 0;
  this->expressionDepthLimit = 0x800;
  return;
}

Assistant:

ExpressionEvalContext(ExpressionContext &ctx, Allocator *allocator): ctx(ctx), stackFrames(allocator), abandonedMemory(allocator)
	{
		errorBuf = 0;
		errorBufSize = 0;
		errorCritical = false;

		globalFrame = 0;

		emulateKnownExternals = false;

		stackDepthLimit = 64;

		variableMemoryLimit = 8 * 1024;

		totalMemory = 0;
		totalMemoryLimit = 64 * 1024;

		instruction = 0;
		instructionsLimit = 64 * 1024;

		expressionDepth = 0;
		expressionDepthLimit = 2048;
	}